

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  float _x;
  float _y;
  bool is_open;
  float height;
  ImGuiWindowFlags window_flags;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  ImGuiViewport *in_stack_00000038;
  char *in_stack_00000040;
  ImVec2 local_2c;
  byte local_21;
  float local_20;
  undefined4 local_1c;
  ImVec2 local_18;
  ImGuiViewport *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = GetMainViewport();
  _x = (local_8->Style).DisplaySafeAreaPadding.x;
  _y = ImMax<float>((local_8->Style).DisplaySafeAreaPadding.y - (local_8->Style).FramePadding.y,0.0)
  ;
  ImVec2::ImVec2(&local_18,_x,_y);
  (local_8->NextWindowData).MenuBarOffsetMinVal = local_18;
  local_1c = 0x508;
  local_20 = GetFrameHeight();
  local_21 = BeginViewportSideBar
                       (in_stack_00000040,in_stack_00000038,g._4_4_,g._0_4_,viewport._4_4_);
  ImVec2::ImVec2(&local_2c,0.0,0.0);
  (local_8->NextWindowData).MenuBarOffsetMinVal = local_2c;
  if ((local_21 & 1) == 0) {
    End();
  }
  else {
    BeginMenuBar();
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)GetMainViewport();

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    // FIXME: This could be generalized as an opt-in way to clamp window->DC.CursorStartPos to avoid SafeArea?
    // FIXME: Consider removing support for safe area down the line... it's messy. Nowadays consoles have support for TV calibration in OS settings.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    float height = GetFrameHeight();
    bool is_open = BeginViewportSideBar("##MainMenuBar", viewport, ImGuiDir_Up, height, window_flags);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);

    if (is_open)
        BeginMenuBar();
    else
        End();
    return is_open;
}